

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

uint rtosc_narguments(char *msg)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = msg + 2;
  do {
    pcVar4 = pcVar3 + -1;
    pcVar3 = pcVar3 + 1;
  } while (*pcVar4 != '\0');
  do {
    pcVar4 = pcVar3;
    pcVar3 = pcVar4 + 1;
  } while (pcVar4[-1] == '\0');
  if (*pcVar4 != '\0') {
    uVar2 = 0;
    do {
      cVar1 = *pcVar3;
      uVar2 = (uVar2 + 1) - (uint)((cVar1 + 0xa5U & 0xfd) == 0);
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
    return uVar2;
  }
  return 0;
}

Assistant:

unsigned rtosc_narguments(const char *msg)
{
    const char *args = rtosc_argument_string(msg);
    int nargs = 0;
    while(*args++)
        nargs += (*args == ']' || *args == '[') ? 0 : 1;
    return nargs;
}